

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

void __thiscall chrono::ChBody::VariablesQbLoadSpeed(ChBody *this)

{
  Index index;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ChVectorRef local_48;
  ChVectorRef local_30;
  
  ChVariables::Get_qb(&local_48,(ChVariables *)&this->variables);
  if (2 < (long)local_48.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_) {
    uVar1 = 3;
    if (((local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ & 7) == 0) &&
       (uVar2 = (ulong)(-((uint)((ulong)local_48.
                                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                        ._0_8_ >> 3) & 0x1fffffff) & 7), uVar2 < 3)) {
      uVar1 = uVar2;
    }
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        *(double *)
         (local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar2 * 8) =
             (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    if (uVar1 < 3) {
      do {
        *(double *)
         (local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar1 * 8) =
             (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[uVar1];
        uVar1 = uVar1 + 1;
      } while (uVar1 != 3);
    }
    ChFrameMoving<double>::GetWvel_loc(&(this->super_ChBodyFrame).super_ChFrameMoving<double>);
    ChVariables::Get_qb(&local_30,(ChVariables *)&this->variables);
    if (5 < (long)local_30.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._8_8_) {
      uVar2 = local_30.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._0_8_ + 0x18;
      uVar1 = 3;
      if (((uVar2 & 7) == 0) && (uVar3 = (ulong)(-((uint)(uVar2 >> 3) & 0x1fffffff) & 7), uVar3 < 3)
         ) {
        uVar1 = uVar3;
      }
      if (uVar1 != 0) {
        uVar3 = 0;
        do {
          *(undefined8 *)(uVar2 + uVar3 * 8) =
               *(undefined8 *)
                (&local_48.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  .field_0x0 + uVar3 * 8);
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      if (uVar1 < 3) {
        do {
          *(undefined8 *)(uVar2 + uVar1 * 8) =
               *(undefined8 *)
                (&local_48.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  .field_0x0 + uVar1 * 8);
          uVar1 = uVar1 + 1;
        } while (uVar1 != 3);
      }
      return;
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChBody::VariablesQbLoadSpeed() {
    // set current speed in 'qb', it can be used by the solver when working in incremental mode
    this->variables.Get_qb().segment(0, 3) = GetCoord_dt().pos.eigen();
    this->variables.Get_qb().segment(3, 3) = GetWvel_loc().eigen();
}